

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

void __thiscall
TIFFImageHandler::ComposePDFPageOrient(TIFFImageHandler *this,T2P_BOX *boxp,uint16_t orientation)

{
  float fVar1;
  float fVar2;
  float f;
  float m1 [9];
  uint16_t orientation_local;
  T2P_BOX *boxp_local;
  TIFFImageHandler *this_local;
  
  if (boxp->x2 <= boxp->x1 && boxp->x1 != boxp->x2) {
    fVar1 = boxp->x1;
    boxp->x1 = boxp->x2;
    boxp->x2 = fVar1;
  }
  if (boxp->y2 <= boxp->y1 && boxp->y1 != boxp->y2) {
    fVar1 = boxp->y1;
    boxp->y1 = boxp->y2;
    boxp->y2 = fVar1;
  }
  fVar1 = boxp->x2 - boxp->x1;
  boxp->mat[0] = fVar1;
  boxp->mat[1] = 0.0;
  boxp->mat[2] = 0.0;
  boxp->mat[3] = 0.0;
  fVar2 = boxp->y2 - boxp->y1;
  boxp->mat[4] = fVar2;
  boxp->mat[5] = 0.0;
  boxp->mat[6] = boxp->x1;
  boxp->mat[7] = boxp->y1;
  boxp->mat[8] = 1.0;
  switch(orientation) {
  case 0:
  case 1:
    break;
  case 2:
    boxp->mat[0] = 0.0 - fVar1;
    boxp->mat[6] = fVar1 + boxp->mat[6];
    break;
  case 3:
    boxp->mat[0] = 0.0 - fVar1;
    boxp->mat[4] = 0.0 - fVar2;
    boxp->mat[6] = fVar1 + boxp->mat[6];
    boxp->mat[7] = fVar2 + boxp->mat[7];
    break;
  case 4:
    boxp->mat[4] = 0.0 - fVar2;
    boxp->mat[7] = fVar2 + boxp->mat[7];
    break;
  case 5:
    boxp->mat[0] = 0.0;
    boxp->mat[1] = 0.0 - fVar1;
    boxp->mat[3] = 0.0 - fVar2;
    boxp->mat[4] = 0.0;
    boxp->mat[6] = fVar2 + boxp->mat[6];
    boxp->mat[7] = fVar1 + boxp->mat[7];
    break;
  case 6:
    boxp->mat[0] = 0.0;
    boxp->mat[1] = 0.0 - fVar1;
    boxp->mat[3] = fVar2;
    boxp->mat[4] = 0.0;
    boxp->mat[7] = fVar1 + boxp->mat[7];
    break;
  case 7:
    boxp->mat[0] = 0.0;
    boxp->mat[1] = fVar1;
    boxp->mat[3] = fVar2;
    boxp->mat[4] = 0.0;
    break;
  case 8:
    boxp->mat[0] = 0.0;
    boxp->mat[1] = fVar1;
    boxp->mat[3] = 0.0 - fVar2;
    boxp->mat[4] = 0.0;
    boxp->mat[6] = fVar2 + boxp->mat[6];
  }
  return;
}

Assistant:

void TIFFImageHandler::ComposePDFPageOrient(T2P_BOX* boxp, uint16_t orientation)
{

	float m1[9];
	float f=0.0;
	
	if( boxp->x1 > boxp->x2)
	{
		f=boxp->x1;
		boxp->x1=boxp->x2;
		boxp->x2 = f;
	}
	if( boxp->y1 > boxp->y2)
	{
		f=boxp->y1;
		boxp->y1=boxp->y2;
		boxp->y2 = f;
	}
	boxp->mat[0]=m1[0]=boxp->x2-boxp->x1;
	boxp->mat[1]=m1[1]=0.0;
	boxp->mat[2]=m1[2]=0.0;
	boxp->mat[3]=m1[3]=0.0;
	boxp->mat[4]=m1[4]=boxp->y2-boxp->y1;
	boxp->mat[5]=m1[5]=0.0;
	boxp->mat[6]=m1[6]=boxp->x1;
	boxp->mat[7]=m1[7]=boxp->y1;
	boxp->mat[8]=m1[8]=1.0;
	switch(orientation)
	{
		case 0:
		case 1:
			break;
		case 2:
			boxp->mat[0]=0.0F-m1[0];
			boxp->mat[6]+=m1[0];
			break;
		case 3:
			boxp->mat[0]=0.0F-m1[0];
			boxp->mat[4]=0.0F-m1[4];
			boxp->mat[6]+=m1[0];
			boxp->mat[7]+=m1[4];
			break;
		case 4:
			boxp->mat[4]=0.0F-m1[4];
			boxp->mat[7]+=m1[4];
			break;
		case 5:
			boxp->mat[0]=0.0F;
			boxp->mat[1]=0.0F-m1[0];
			boxp->mat[3]=0.0F-m1[4];
			boxp->mat[4]=0.0F;
			boxp->mat[6]+=m1[4];
			boxp->mat[7]+=m1[0];
			break;
		case 6:
			boxp->mat[0]=0.0F;
			boxp->mat[1]=0.0F-m1[0];
			boxp->mat[3]=m1[4];
			boxp->mat[4]=0.0F;
			boxp->mat[7]+=m1[0];
			break;
		case 7:
			boxp->mat[0]=0.0F;
			boxp->mat[1]=m1[0];
			boxp->mat[3]=m1[4];
			boxp->mat[4]=0.0F;
			break;
		case 8:
			boxp->mat[0]=0.0F;
			boxp->mat[1]=m1[0];
			boxp->mat[3]=0.0F-m1[4];
			boxp->mat[4]=0.0F;
			boxp->mat[6]+=m1[4];
			break;
	}
}